

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_ops.h
# Opt level: O0

mat<float,_3UL> * hmi::invert<float>(mat<float,_3UL> *input)

{
  mat_accessor *in_RSI;
  mat_accessor *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  mat<float,_3UL> *result;
  float det;
  
  mat<float,_3UL>::mat((mat<float,_3UL> *)in_RDI);
  fVar1 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar2 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_0UL,_0UL>::operator=
            ((mat_accessor<float,_3UL,_0UL,_0UL> *)in_RDI,fVar1 * fVar2 + -(fVar3 * fVar4));
  fVar1 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar2 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_0UL,_1UL>::operator=
            ((mat_accessor<float,_3UL,_0UL,_1UL> *)in_RDI,-(fVar1 * fVar2 + -(fVar3 * fVar4)));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar5 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_0UL,_2UL>::operator=
            ((mat_accessor<float,_3UL,_0UL,_2UL> *)in_RDI,fVar3 * fVar4 + -(fVar5 * fVar6));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar7 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_1UL,_0UL>::operator=
            ((mat_accessor<float,_3UL,_1UL,_0UL> *)in_RDI,-(fVar3 * fVar4 + -(fVar6 * fVar7)));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar7 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_1UL,_1UL>::operator=
            ((mat_accessor<float,_3UL,_1UL,_1UL> *)in_RDI,fVar3 * fVar4 + -(fVar6 * fVar7));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar7 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_1UL,_2UL>::operator=
            ((mat_accessor<float,_3UL,_1UL,_2UL> *)in_RDI,-(fVar3 * fVar4 + -(fVar6 * fVar7)));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar7 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_2UL,_0UL>::operator=
            ((mat_accessor<float,_3UL,_2UL,_0UL> *)in_RDI,fVar3 * fVar4 + -(fVar6 * fVar7));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar7 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_2UL,_1UL>::operator=
            ((mat_accessor<float,_3UL,_2UL,_1UL> *)in_RDI,-(fVar3 * fVar4 + -(fVar6 * fVar7)));
  fVar3 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar4 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar6 = mat_accessor::operator_cast_to_float(in_RSI);
  fVar7 = mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor<float,_3UL,_2UL,_2UL>::operator=
            ((mat_accessor<float,_3UL,_2UL,_2UL> *)in_RDI,fVar3 * fVar4 + -(fVar6 * fVar7));
  mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor::operator_cast_to_float(in_RDI);
  mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor::operator_cast_to_float(in_RDI);
  mat_accessor::operator_cast_to_float(in_RSI);
  mat_accessor::operator_cast_to_float(in_RDI);
  operator/=((mat<float,_3UL> *)CONCAT44(fVar5,fVar1),fVar2);
  return (mat<float,_3UL> *)in_RDI;
}

Assistant:

constexpr
  mat<T, 3> invert(const mat<T, 3>& input) {
    mat<T, 3> result;

    result.xx = input.yy * input.zz - input.zy * input.yz;
    result.xy = - (input.xy * input.zz - input.zy * input.xz);
    result.xz = input.xy * input.yz - input.yy * input.xz;
    result.yx = - (input.yx * input.zz - input.zx * input.yz);
    result.yy = input.xx * input.zz - input.zx * input.xz;
    result.yz = - (input.xx * input.yz - input.yx * input.xz);
    result.zx = input.yx * input.zy - input.zx * input.yy;
    result.zy = - (input.xx * input.zy - input.zx * input.xy);
    result.zz = input.xx * input.yy - input.yx * input.xy;

    T det = input.xx * result.xx + input.xy * result.yx + input.xz * result.zx;
    result /= det;
    return result;
  }